

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureResolver> *
google::protobuf::FeatureResolver::Create
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *compiled_defaults)

{
  Edition edition_00;
  void *pvVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  Rep *pRVar4;
  FeatureSet *from;
  undefined1 *puVar5;
  Edition EVar6;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar7;
  bool bVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view message;
  StatusOr<google::protobuf::FeatureSet> features;
  Status _status;
  Status local_188;
  Edition local_17c;
  StringifySink local_178;
  StringifySink local_158;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_138;
  char *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  undefined8 local_118;
  char *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  undefined8 local_f8;
  char *local_f0;
  FeatureSetDefaults *local_e0;
  void **local_d8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1 local_d0;
  char *local_c8;
  long local_c0 [8];
  FeatureSet local_80;
  
  EVar6 = (compiled_defaults->field_0)._impl_.minimum_edition_;
  if ((int)edition < (int)EVar6) {
    protobuf::(anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_138.status_,"Edition ",edition,
               " is earlier than the minimum supported edition ",EVar6);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               &local_138.status_);
    if (((ulong)local_138 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_138);
    }
  }
  else {
    EVar6 = (compiled_defaults->field_0)._impl_.maximum_edition_;
    if ((int)EVar6 < (int)edition) {
      protobuf::(anonymous_namespace)::
      Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                ((_anonymous_namespace_ *)&local_138.status_,"Edition ",edition,
                 " is later than the maximum supported edition ",EVar6);
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
      StatusOrData<absl::lts_20250127::Status,_0>
                (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                 &local_138.status_);
      if (((ulong)local_138 & 1) == 0) {
        absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_138);
      }
    }
    else {
      this = &(compiled_defaults->field_0)._impl_.defaults_;
      pRVar7 = this;
      if ((undefined1  [40])((undefined1  [40])compiled_defaults->field_0 & (undefined1  [40])0x1)
          != (undefined1  [40])0x0) {
        pRVar4 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        pRVar7 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                 pRVar4->elements;
      }
      local_17c = edition;
      if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar4 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
        this = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
               pRVar4->elements;
      }
      local_d8 = &(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&compiled_defaults->field_0 + 0x10);
      local_e0 = compiled_defaults;
      if (pRVar7 != (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                     *)local_d8) {
        EVar6 = EDITION_UNKNOWN;
        do {
          pvVar1 = (pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          edition_00 = *(Edition *)((long)pvVar1 + 0x28);
          if (edition_00 == EDITION_UNKNOWN) {
            protobuf::(anonymous_namespace)::
            Error<char_const*,google::protobuf::Edition,char_const*>
                      ((_anonymous_namespace_ *)&local_138.status_,"Invalid edition ",
                       EDITION_UNKNOWN," specified.");
            absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
            StatusOrData<absl::lts_20250127::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::FeatureResolver>,&local_138.status_);
            if (((ulong)local_138 & 1) == 0) {
              absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_138);
            }
LAB_002507a9:
            bVar8 = false;
          }
          else {
            if ((EVar6 != EDITION_UNKNOWN) && ((int)edition_00 <= (int)EVar6)) {
              local_158.buffer_.field_2._8_8_ = 0;
              local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
              local_158.buffer_._M_string_length = 0;
              local_158.buffer_.field_2._M_allocated_capacity = 0;
              AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_158,EVar6);
              sVar3 = local_158.buffer_._M_string_length;
              _Var2._M_p = local_158.buffer_._M_dataplus._M_p;
              local_178.buffer_.field_2._8_8_ = 0;
              local_178.buffer_._M_dataplus._M_p = (pointer)&local_178.buffer_.field_2;
              local_178.buffer_._M_string_length = 0;
              local_178.buffer_.field_2._M_allocated_capacity = 0;
              AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
                        (&local_178,edition_00);
              local_138 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)
                          0x3b;
              local_130 = "Feature set defaults are not strictly increasing.  Edition ";
              local_128 = sVar3;
              local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var2._M_p;
              local_118 = 0x25;
              local_110 = " is greater than or equal to edition ";
              local_108 = local_178.buffer_._M_string_length;
              local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_178.buffer_._M_dataplus._M_p;
              local_f8 = 1;
              local_f0 = ".";
              pieces._M_len = local_178.buffer_._M_string_length;
              pieces._M_array = (iterator)&DAT_00000005;
              absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                        ((string *)&local_d0.status_,(strings_internal *)&local_138.status_,pieces);
              message._M_str = local_c8;
              message._M_len = (size_t)&local_188;
              absl::lts_20250127::FailedPreconditionError(message);
              if (local_d0 !=
                  (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)local_c0
                 ) {
                operator_delete((void *)local_d0,local_c0[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178.buffer_._M_dataplus._M_p != &local_178.buffer_.field_2) {
                operator_delete(local_178.buffer_._M_dataplus._M_p,
                                local_178.buffer_.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158.buffer_._M_dataplus._M_p != &local_158.buffer_.field_2) {
                operator_delete(local_158.buffer_._M_dataplus._M_p,
                                local_158.buffer_.field_2._M_allocated_capacity + 1);
              }
              absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>
              ::StatusOrData<absl::lts_20250127::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::FeatureResolver>,&local_188);
              if ((local_188.rep_ & 1) == 0) {
                absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_188.rep_);
              }
              goto LAB_002507a9;
            }
            puVar5 = *(undefined1 **)((long)pvVar1 + 0x20);
            if ((FeatureSet *)puVar5 == (FeatureSet *)0x0) {
              puVar5 = _FeatureSet_default_instance_;
            }
            FeatureSet::FeatureSet
                      ((FeatureSet *)&local_138.status_,(Arena *)0x0,(FeatureSet *)puVar5);
            puVar5 = *(undefined1 **)((long)pvVar1 + 0x18);
            if ((MessageLite *)puVar5 == (MessageLite *)0x0) {
              puVar5 = _FeatureSet_default_instance_;
            }
            FeatureSet::MergeImpl((MessageLite *)&local_138.status_,(MessageLite *)puVar5);
            anon_unknown_21::ValidateMergedFeatures
                      ((anon_unknown_21 *)&local_d0.status_,(FeatureSet *)&local_138.status_);
            bVar8 = local_d0 ==
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1;
            if (bVar8) {
              EVar6 = *(Edition *)((long)pvVar1 + 0x28);
            }
            else {
              absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>
              ::StatusOrData<const_absl::lts_20250127::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::FeatureResolver>,&local_d0.status_);
              absl::lts_20250127::Status::~Status(&local_d0.status_);
            }
            FeatureSet::~FeatureSet((FeatureSet *)&local_138.status_);
          }
          if (!bVar8) {
            return __return_storage_ptr__;
          }
          pRVar7 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                    *)&(pRVar7->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar7 != (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                            *)local_d8);
      }
      internal::GetEditionFeatureSetDefaults
                ((StatusOr<google::protobuf::FeatureSet> *)&local_138.status_,local_17c,local_e0);
      local_d0 = local_138;
      if (((ulong)local_138 & 1) == 0) {
        LOCK();
        *(int *)local_138 = *(int *)local_138 + 1;
        UNLOCK();
      }
      if (local_138 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1
         ) {
        from = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::value
                         ((StatusOr<google::protobuf::FeatureSet> *)&local_138.status_);
        FeatureSet::FeatureSet(&local_80,(Arena *)0x0,from);
        FeatureSet::FeatureSet((FeatureSet *)&local_d0.status_,(Arena *)0x0,&local_80);
        FeatureSet::FeatureSet
                  (&(__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>).
                    field_1.data_.defaults_,(Arena *)0x0,(FeatureSet *)&local_d0.status_);
        (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>).field_0 =
             (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1;
        FeatureSet::~FeatureSet((FeatureSet *)&local_d0.status_);
        FeatureSet::~FeatureSet(&local_80);
      }
      else {
        absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
        StatusOrData<const_absl::lts_20250127::Status,_0>
                  (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
                   &local_d0.status_);
        absl::lts_20250127::Status::~Status(&local_d0.status_);
      }
      absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData((StatusOrData<google::protobuf::FeatureSet> *)&local_138.status_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> FeatureResolver::Create(
    Edition edition, const FeatureSetDefaults& compiled_defaults) {
  if (edition < compiled_defaults.minimum_edition()) {
    return Error("Edition ", edition,
                 " is earlier than the minimum supported edition ",
                 compiled_defaults.minimum_edition());
  }
  if (compiled_defaults.maximum_edition() < edition) {
    return Error("Edition ", edition,
                 " is later than the maximum supported edition ",
                 compiled_defaults.maximum_edition());
  }

  // Validate compiled defaults.
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : compiled_defaults.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return Error("Invalid edition ", edition_default.edition(),
                   " specified.");
    }
    if (prev_edition != EDITION_UNKNOWN) {
      if (edition_default.edition() <= prev_edition) {
        return Error(
            "Feature set defaults are not strictly increasing.  Edition ",
            prev_edition, " is greater than or equal to edition ",
            edition_default.edition(), ".");
      }
    }
    FeatureSet features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    RETURN_IF_ERROR(ValidateMergedFeatures(features));

    prev_edition = edition_default.edition();
  }

  auto features =
      internal::GetEditionFeatureSetDefaults(edition, compiled_defaults);
  RETURN_IF_ERROR(features.status());
  return FeatureResolver(std::move(features.value()));
}